

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interact.cc
# Opt level: O2

base_learner * interact_setup(options_i *options,vw *all)

{
  int iVar1;
  ostream *poVar2;
  base_learner *l;
  single_learner *base;
  learner<interact,_example> *plVar3;
  allocator local_212;
  allocator local_211;
  string s;
  string local_1f0 [32];
  string local_1d0;
  free_ptr<interact> data;
  string local_180 [64];
  bool local_140;
  string local_110;
  option_group_definition new_options;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string
            ((string *)&local_110,"Interact via elementwise multiplication",(allocator *)&data);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::string((string *)&local_1d0,"interact",&local_211);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&data,&local_1d0,&s);
  local_140 = true;
  std::__cxx11::string::string
            (local_1f0,"Put weights on feature products from namespaces <n1> and <n2>",&local_212);
  std::__cxx11::string::_M_assign(local_180);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_b8,
               (typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&data);
  VW::config::option_group_definition::add<std::__cxx11::string>(&new_options,&local_b8);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option(&local_b8);
  std::__cxx11::string::~string(local_1f0);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&data);
  std::__cxx11::string::~string((string *)&local_1d0);
  (**options->_vptr_options_i)(options,&new_options);
  std::__cxx11::string::string((string *)&data,"interact",(allocator *)local_1f0);
  iVar1 = (*options->_vptr_options_i[1])(options,&data);
  std::__cxx11::string::~string((string *)&data);
  if ((char)iVar1 != '\0') {
    if (s._M_string_length == 2) {
      scoped_calloc_or_throw<interact>();
      (data._M_t.super___uniq_ptr_impl<interact,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_interact_*,_void_(*)(void_*)>.super__Head_base<0UL,_interact_*,_false>
      ._M_head_impl)->n1 = *s._M_dataplus._M_p;
      (data._M_t.super___uniq_ptr_impl<interact,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_interact_*,_void_(*)(void_*)>.super__Head_base<0UL,_interact_*,_false>
      ._M_head_impl)->n2 = s._M_dataplus._M_p[1];
      if (all->quiet == false) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Interacting namespaces ");
        poVar2 = std::operator<<(poVar2,(data._M_t.super___uniq_ptr_impl<interact,_void_(*)(void_*)>
                                         ._M_t.super__Tuple_impl<0UL,_interact_*,_void_(*)(void_*)>.
                                         super__Head_base<0UL,_interact_*,_false>._M_head_impl)->n1)
        ;
        poVar2 = std::operator<<(poVar2," and ");
        poVar2 = std::operator<<(poVar2,(data._M_t.super___uniq_ptr_impl<interact,_void_(*)(void_*)>
                                         ._M_t.super__Tuple_impl<0UL,_interact_*,_void_(*)(void_*)>.
                                         super__Head_base<0UL,_interact_*,_false>._M_head_impl)->n2)
        ;
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      (data._M_t.super___uniq_ptr_impl<interact,_void_(*)(void_*)>._M_t.
       super__Tuple_impl<0UL,_interact_*,_void_(*)(void_*)>.super__Head_base<0UL,_interact_*,_false>
      ._M_head_impl)->all = all;
      l = setup_base(options,all);
      base = LEARNER::as_singleline<char,char>(l);
      plVar3 = LEARNER::init_learner<interact,example,LEARNER::learner<char,example>>
                         (&data,base,predict_or_learn<true,true>,predict_or_learn<false,true>,1);
      *(undefined8 *)(plVar3 + 0xb8) = *(undefined8 *)(plVar3 + 0x18);
      *(undefined8 *)(plVar3 + 0xc0) = *(undefined8 *)(plVar3 + 0x20);
      *(code **)(plVar3 + 200) = finish;
      std::unique_ptr<interact,_void_(*)(void_*)>::~unique_ptr(&data);
      goto LAB_001c9bb0;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"Need two namespace arguments to interact: ");
    poVar2 = std::operator<<(poVar2,(string *)&s);
    std::operator<<(poVar2," won\'t do EXITING\n");
  }
  plVar3 = (learner<interact,_example> *)0x0;
LAB_001c9bb0:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&s);
  return (base_learner *)plVar3;
}

Assistant:

LEARNER::base_learner* interact_setup(options_i& options, vw& all)
{
  string s;
  option_group_definition new_options("Interact via elementwise multiplication");
  new_options.add(
      make_option("interact", s).keep().help("Put weights on feature products from namespaces <n1> and <n2>"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("interact"))
    return nullptr;

  if (s.length() != 2)
  {
    cerr << "Need two namespace arguments to interact: " << s << " won't do EXITING\n";
    return nullptr;
  }

  auto data = scoped_calloc_or_throw<interact>();

  data->n1 = (unsigned char)s[0];
  data->n2 = (unsigned char)s[1];
  if (!all.quiet)
    cerr << "Interacting namespaces " << data->n1 << " and " << data->n2 << endl;
  data->all = &all;

  LEARNER::learner<interact, example>* l;
  l = &LEARNER::init_learner(
      data, as_singleline(setup_base(options, all)), predict_or_learn<true, true>, predict_or_learn<false, true>, 1);

  l->set_finish(finish);
  return make_base(*l);
}